

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void __thiscall
PhyloTree::setEdges(PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *unaff_retaddr;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void PhyloTree::setEdges(vector<PhyloTreeEdge> edges) {
    this->edges = std::move(edges);
}